

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::IsSet(cmMakefile *this,string *name)

{
  bool bVar1;
  char *val;
  
  val = GetDefinition(this,name);
  if ((val == (char *)0x0) || (*val == '\0')) {
    bVar1 = false;
  }
  else {
    bVar1 = cmSystemTools::IsNOTFOUND(val);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool cmMakefile::IsSet(const std::string& name) const
{
  const char* value = this->GetDefinition(name);
  if ( !value )
    {
    return false;
    }

  if ( ! *value )
    {
    return false;
    }

  if ( cmSystemTools::IsNOTFOUND(value) )
    {
    return false;
    }

  return true;
}